

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ffs_gen.c
# Opt level: O1

void free_oprnd(dill_stream c,iogen_oprnd oprnd)

{
  int type;
  undefined *puVar1;
  
  if (boolean_type < oprnd.data_type) {
    return;
  }
  if ((0xc2U >> (oprnd.data_type & 0x1f) & 1) == 0) {
    if ((0x14U >> (oprnd.data_type & 0x1f) & 1) == 0) {
      if (oprnd.data_type != float_type) {
        return;
      }
      if (oprnd.size == 4) {
        type = 9;
      }
      else {
        if (oprnd.size != 8) {
          return;
        }
        type = 10;
      }
      goto LAB_00115561;
    }
    if (7 < oprnd.size - 1U) {
      return;
    }
    if ((0x8bU >> (oprnd.size - 1U & 0x1f) & 1) == 0) {
      return;
    }
    puVar1 = &DAT_0013b1d4;
  }
  else {
    if (7 < oprnd.size - 1U) {
      return;
    }
    if ((0x8bU >> (oprnd.size - 1U & 0x1f) & 1) == 0) {
      return;
    }
    puVar1 = &DAT_0013b1b4;
  }
  type = *(int *)(puVar1 + (ulong)(oprnd.size - 1) * 4);
LAB_00115561:
  ffs_putreg(c,oprnd.vc_reg,type);
  return;
}

Assistant:

void
free_oprnd(dill_stream c, iogen_oprnd oprnd)
{
    REG_DEBUG(("put %d in free\n", _vrr(oprnd.vc_reg)));
    switch (oprnd.data_type) {
    case unknown_type:
	assert(FALSE);
	break;
    case integer_type:
    case boolean_type:
    case enumeration_type:
	switch (oprnd.size) {
	case 1:		/* sizeof char */
	    ffs_putreg(c, oprnd.vc_reg, DILL_C);
	    break;
	case 2:		/* sizeof short */
	    ffs_putreg(c, oprnd.vc_reg, DILL_S);
	    break;
	case 4:		/* sizeof int */
	    ffs_putreg(c, oprnd.vc_reg, DILL_I);
	    break;
#if SIZEOF_SIZE_T != 4
	case SIZEOF_SIZE_T:
	    ffs_putreg(c, oprnd.vc_reg, DILL_L);
	    break;
#else
	case 8:
	    /* simulate with double reg */
	    ffs_putreg(c, oprnd.vc_reg, DILL_I);
	    ffs_putreg(c, oprnd.vc_reg2, DILL_I);
	    REG_DEBUG(("put %d in free\n", _vrr(oprnd.vc_reg2)));
	    break;
#endif
	}
	break;
    case unsigned_type:
    case char_type:
	switch (oprnd.size) {
	case 1:		/* sizeof char */
	    ffs_putreg(c, oprnd.vc_reg, DILL_UC);
	    break;
	case 2:		/* sizeof short */
	    ffs_putreg(c, oprnd.vc_reg, DILL_US);
	    break;
	case 4:		/* sizeof int */
	    ffs_putreg(c, oprnd.vc_reg, DILL_U);
	    break;
#if SIZEOF_SIZE_T != 4
	case SIZEOF_SIZE_T:
	    ffs_putreg(c, oprnd.vc_reg, DILL_UL);
	    break;
#else
	case 8:
	    /* simulate with double reg */
	    ffs_putreg(c, oprnd.vc_reg, DILL_U);
	    ffs_putreg(c, oprnd.vc_reg2, DILL_U);
	    /* vc_reg2 holds high value */
	    REG_DEBUG(("put %d in free\n", _vrr(oprnd.vc_reg2)));
	    break;
#endif
	}
	break;
    case float_type:
	switch (oprnd.size) {
	case SIZEOF_FLOAT:	/* sizeof char */
	    ffs_putreg(c, oprnd.vc_reg, DILL_F);
	    break;
	case SIZEOF_DOUBLE:	/* sizeof short */
	    ffs_putreg(c, oprnd.vc_reg, DILL_D);
	    break;
	}
	break;
    case string_type:
	break;
    }
}